

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void InputTextReconcileUndoStateAfterUserCallback
               (ImGuiInputTextState *state,char *new_buf_a,int new_length_a)

{
  uint uVar1;
  unsigned_short *puVar2;
  ImGuiContext *pIVar3;
  long lVar4;
  uint uVar5;
  ImWchar *pIVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  pIVar3 = GImGui;
  puVar2 = (state->TextW).Data;
  uVar1 = state->CurLenW;
  uVar5 = ImTextCountCharsFromUtf8(new_buf_a,new_buf_a + new_length_a);
  iVar9 = uVar5 * 2 + 2;
  pIVar6 = (ImWchar *)(pIVar3->TempBuffer).Data;
  if ((pIVar3->TempBuffer).Capacity < iVar9) {
    if (pIVar6 != (ImWchar *)0x0) {
      ImGui::MemFree(pIVar6);
    }
    pIVar6 = (ImWchar *)ImGui::MemAlloc((long)iVar9);
    (pIVar3->TempBuffer).Data = (char *)pIVar6;
    (pIVar3->TempBuffer).Capacity = iVar9;
  }
  uVar13 = 0;
  ImTextStrFromUtf8(pIVar6,uVar5 + 1,new_buf_a,new_buf_a + new_length_a,(char **)0x0);
  uVar12 = uVar5;
  if ((int)uVar1 < (int)uVar5) {
    uVar12 = uVar1;
  }
  if (0 < (int)uVar12) {
    uVar13 = 0;
    do {
      if (puVar2[uVar13] != pIVar6[uVar13]) goto LAB_00217a64;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
    uVar13 = (ulong)uVar12;
  }
LAB_00217a64:
  uVar12 = (uint)uVar13;
  if (uVar5 != uVar12 || uVar1 != uVar12) {
    lVar4 = 0;
    do {
      lVar11 = lVar4;
      if ((lVar11 + (int)uVar1 <= (long)(int)uVar12) || ((int)uVar5 + lVar11 <= (long)(int)uVar12))
      break;
      lVar4 = lVar11 + -1;
    } while (puVar2[(long)(int)uVar1 + lVar11 + -1] == pIVar6[(long)(int)uVar5 + lVar11 + -1]);
    uVar8 = (ulong)(~uVar12 + uVar1) + lVar11;
    iVar9 = (int)lVar11;
    iVar7 = (int)uVar8;
    if ((-1 < (int)(iVar9 + ~uVar12 + uVar5)) || (-1 < iVar7)) {
      pIVar6 = ImStb::stb_text_createundo
                         (&(state->Stb).undostate,uVar12,(uVar1 - uVar12) + iVar9,
                          (uVar5 - uVar12) + iVar9);
      if ((pIVar6 != (ImWchar *)0x0) && (-1 < iVar7)) {
        uVar10 = 0xffffffffffffffff;
        do {
          pIVar6[uVar10 + 1] = (state->TextW).Data[(uVar13 & 0xffffffff) + uVar10 + 1];
          uVar10 = uVar10 + 1;
        } while (uVar10 < (uVar8 & 0xffffffff));
      }
    }
  }
  return;
}

Assistant:

static void InputTextReconcileUndoStateAfterUserCallback(ImGuiInputTextState* state, const char* new_buf_a, int new_length_a)
{
    ImGuiContext& g = *GImGui;
    const ImWchar* old_buf = state->TextW.Data;
    const int old_length = state->CurLenW;
    const int new_length = ImTextCountCharsFromUtf8(new_buf_a, new_buf_a + new_length_a);
    g.TempBuffer.reserve_discard((new_length + 1) * sizeof(ImWchar));
    ImWchar* new_buf = (ImWchar*)(void*)g.TempBuffer.Data;
    ImTextStrFromUtf8(new_buf, new_length + 1, new_buf_a, new_buf_a + new_length_a);

    const int shorter_length = ImMin(old_length, new_length);
    int first_diff;
    for (first_diff = 0; first_diff < shorter_length; first_diff++)
        if (old_buf[first_diff] != new_buf[first_diff])
            break;
    if (first_diff == old_length && first_diff == new_length)
        return;

    int old_last_diff = old_length - 1;
    int new_last_diff = new_length - 1;
    for (; old_last_diff >= first_diff && new_last_diff >= first_diff; old_last_diff--, new_last_diff--)
        if (old_buf[old_last_diff] != new_buf[new_last_diff])
            break;

    const int insert_len = new_last_diff - first_diff + 1;
    const int delete_len = old_last_diff - first_diff + 1;
    if (insert_len > 0 || delete_len > 0)
        if (STB_TEXTEDIT_CHARTYPE* p = stb_text_createundo(&state->Stb.undostate, first_diff, delete_len, insert_len))
            for (int i = 0; i < delete_len; i++)
                p[i] = ImStb::STB_TEXTEDIT_GETCHAR(state, first_diff + i);
}